

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

void newproxy_weaktable(lua_State *L)

{
  GCtab *t_00;
  GCstr *pGVar1;
  TValue *pTVar2;
  GCtab *t;
  lua_State *L_local;
  
  t_00 = lj_tab_new(L,0,1);
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  pTVar2->u64 = (ulong)t_00 | 0xfffa000000000000;
  (t_00->metatable).gcptr64 = (uint64_t)t_00;
  pGVar1 = lj_str_new(L,"__mode",6);
  pTVar2 = lj_tab_setstr(L,t_00,pGVar1);
  pGVar1 = lj_str_new(L,"kv",2);
  pTVar2->u64 = (ulong)pGVar1 | 0xfffd800000000000;
  t_00->nomm = 0xf7;
  return;
}

Assistant:

static void newproxy_weaktable(lua_State *L)
{
  /* NOBARRIER: The table is new (marked white). */
  GCtab *t = lj_tab_new(L, 0, 1);
  settabV(L, L->top++, t);
  setgcref(t->metatable, obj2gco(t));
  setstrV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "__mode")),
	    lj_str_newlit(L, "kv"));
  t->nomm = (uint8_t)(~(1u<<MM_mode));
}